

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.cpp
# Opt level: O3

defV * __thiscall
helics::apps::PhasorGenerator::generate_abi_cxx11_
          (defV *__return_storage_ptr__,PhasorGenerator *this,Time signalTime)

{
  double dVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  lVar2 = signalTime.internalTimeCode - (this->super_SignalGenerator).lastTime.internalTimeCode;
  dVar4 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
  dVar3 = this->dfdt * dVar4 + this->frequency;
  this->frequency = dVar3;
  this->amplitude = this->dAdt * dVar4 + this->amplitude;
  dVar3 = dVar3 * dVar4 * 6.283185307179586;
  dVar4 = cos(dVar3);
  dVar3 = sin(dVar3);
  *(double *)(this->rotation)._M_value = dVar4;
  *(double *)((this->rotation)._M_value + 8) = dVar3;
  std::complex<double>::operator*=(&this->state,&this->rotation);
  (this->super_SignalGenerator).lastTime.internalTimeCode = signalTime.internalTimeCode;
  dVar3 = this->bias_imag;
  dVar4 = this->amplitude;
  dVar1 = *(double *)((this->state)._M_value + 8);
  *(double *)
   &(__return_storage_ptr__->
    super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ).
    super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    ._M_u = dVar4 * *(double *)(this->state)._M_value + this->bias_real;
  *(double *)
   ((long)&(__return_storage_ptr__->
           super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ).
           super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           .
           super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
           ._M_u + 8) = dVar4 * dVar1 + dVar3;
  (__return_storage_ptr__->
  super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ).
  super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  ._M_index = '\x03';
  return __return_storage_ptr__;
}

Assistant:

defV PhasorGenerator::generate(Time signalTime)
    {
        auto dt = signalTime - lastTime;

        frequency += dfdt * dt;
        amplitude += dAdt * dt;
        rotation = std::polar(1.0, frequency * dt * (2.0 * pi));
        state *= rotation;
        lastTime = signalTime;
        return amplitude * state + std::complex<double>(bias_real, bias_imag);
    }